

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O3

string * getTargetLanguageCode(string *__return_storage_ptr__,Parser *PhParser,string *TgtLang)

{
  char *__s1;
  int iVar1;
  Sema S;
  GraphCodeGen Gen;
  undefined1 *local_3d8;
  long local_3d0;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [40];
  undefined1 local_390 [20];
  uint local_37c;
  bool local_378;
  undefined4 local_377;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_320;
  _Alloc_hider local_308;
  size_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  Sema local_2e8;
  GraphCodeGen local_1c0;
  
  phaeton::Sema::Sema(&local_2e8);
  phaeton::ASTVisitor::visitProgram(&local_2e8.super_ASTVisitor,PhParser->AST);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  __s1 = (TgtLang->_M_dataplus)._M_p;
  iVar1 = strcmp(__s1,"OPENMP");
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"NUMPY");
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ph-opt",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\x1b[31m wip: \x1b[0m",0xf);
      std::operator<<((ostream *)&std::cout,"Target language not support yet\n");
    }
    else {
      iVar1 = strcmp(__s1,"OPENCL");
      if (iVar1 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ph-opt",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\x1b[31m wip: \x1b[0m",0xf);
        std::operator<<((ostream *)&std::cout,"Target language not support yet\n");
      }
      else {
        iVar1 = strcmp(__s1,"CUDA");
        if (iVar1 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ph-opt",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\x1b[31m wip: \x1b[0m",0xf);
          std::operator<<((ostream *)&std::cout,"Target language not support yet\n");
        }
        else {
          iVar1 = strcmp(__s1,"BANG");
          if (iVar1 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ph-opt",6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\x1b[31m wip: \x1b[0m",0xf);
            std::operator<<((ostream *)&std::cout,"Target language not support yet\n");
          }
          else {
            iVar1 = strcmp(__s1,"CCE");
            if (iVar1 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ph-opt",6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\x1b[31m wip: \x1b[0m",0xf);
              std::operator<<((ostream *)&std::cout,"Target language not support yet\n");
            }
            else {
              iVar1 = strcmp(__s1,"TPU");
              if (iVar1 != 0) goto LAB_0010e094;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ph-opt",6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\x1b[31m wip: \x1b[0m",0xf);
              std::operator<<((ostream *)&std::cout,"Target language not support yet\n");
            }
          }
        }
      }
    }
    exit(0);
  }
  local_3b8._0_8_ = local_3b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"omp_func","");
  phaeton::GraphCodeGen::GraphCodeGen(&local_1c0,&local_2e8,(string *)local_3b8);
  if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
    operator_delete((void *)local_3b8._0_8_);
  }
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"float","");
  local_3b8._0_8_ = &PTR_visitAddExpr_00160dd0;
  local_3b8._8_8_ = &local_1c0;
  local_3b8._24_8_ = local_390;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_3b8 + 0x18),local_3d8,local_3d8 + local_3d0);
  local_370._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_370._M_impl.super__Rb_tree_header._M_header;
  local_37c = 0;
  local_378 = true;
  local_370._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_370._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_377._0_1_ = false;
  local_377._1_1_ = false;
  local_377._2_1_ = false;
  local_377._3_1_ = false;
  local_370._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_320.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_320.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_320.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_300 = 0;
  local_2f8._M_local_buf[0] = '\0';
  local_370._M_impl.super__Rb_tree_header._M_header._M_right =
       local_370._M_impl.super__Rb_tree_header._M_header._M_left;
  local_308._M_p = (pointer)&local_2f8;
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  phaeton::OMPCG::genCode((OMPCG *)local_3b8,PhParser->AST);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  local_3b8._0_8_ = &PTR_visitAddExpr_00160dd0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_p != &local_2f8) {
    operator_delete(local_308._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_320);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_338);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_370);
  if ((undefined1 *)local_3b8._24_8_ != local_390) {
    operator_delete((void *)local_3b8._24_8_);
  }
  local_1c0.super_CodeGen.super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)&PTR_visitProgram_001610e8;
  std::
  _Rb_tree<const_phaeton::Expression_*,_std::pair<const_phaeton::Expression_*const,_const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>,_std::_Select1st<std::pair<const_phaeton::Expression_*const,_const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>,_std::less<const_phaeton::Expression_*>,_std::allocator<std::pair<const_phaeton::Expression_*const,_const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>_>
  ::~_Rb_tree(&local_1c0.ExprGraphs._M_t);
  std::
  _Rb_tree<const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_std::_Identity<const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>,_std::less<const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>,_std::allocator<const_phaeton::TensorGraph<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*>_>
  ::~_Rb_tree(&local_1c0.Graphs._M_t);
  if (local_1c0.CurrentLegs.
      super__Vector_base<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>,_std::allocator<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.CurrentLegs.
                    super__Vector_base<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>,_std::allocator<std::pair<const_phaeton::GraphNode<phaeton::AddressID<phaeton::ExpressionNode>,_phaeton::StringID>_*,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  phaeton::CodeGen::~CodeGen(&local_1c0.super_CodeGen);
LAB_0010e094:
  phaeton::Sema::~Sema(&local_2e8);
  return __return_storage_ptr__;
}

Assistant:

std::string getTargetLanguageCode(const Parser &PhParser,
                                  const std::string &TgtLang) {
  Sema S;
  S.visitProgram(PhParser.getAST());
  std::string TgtCode = "";
  if (!std::strcmp(TgtLang.c_str(), "OPENMP")) {
    GraphCodeGen Gen(&S, "omp_func");
    // FIXME: CodeGen mode must be sync with a specific codegen, i.e.
    // if we omit the function name, the wrapper caller will be wrong.
    OMPCG OMP(&Gen, true);
    OMP.genCode(PhParser.getAST());
    TgtCode = OMP.getCode();
  } else if (!std::strcmp(TgtLang.c_str(), "NUMPY")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "OPENCL")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "CUDA")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "BANG")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "CCE")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "TPU")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  }
  return TgtCode;
}